

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O3

optional<PSEngine::TurnHistory> * __thiscall
PSEngine::next_turn(optional<PSEngine::TurnHistory> *__return_storage_ptr__,PSEngine *this)

{
  TurnHistory *__x;
  int iVar1;
  pointer pWVar2;
  bool bVar3;
  bool bVar4;
  pointer pCVar5;
  WinCondition *win_condition;
  pointer p_win_condition;
  vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_> subturn_commands;
  TurnHistory last_turn_history_save;
  Level last_turn_save;
  vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_> local_b8;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *local_a0;
  vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_> local_98;
  undefined8 local_80;
  vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_> local_78;
  bool local_60;
  value_type local_58;
  
  local_58.size.y = (this->m_current_level).size.y;
  local_58.level_idx = (this->m_current_level).level_idx;
  local_58.size.x = (this->m_current_level).size.x;
  local_a0 = &(this->m_current_level).cells;
  std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::vector(&local_58.cells,local_a0);
  __x = &this->m_turn_history;
  std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::vector
            (&local_78,&__x->subturns);
  local_60 = (this->m_turn_history).was_turn_cancelled;
  bVar3 = false;
  local_80 = 0;
  local_b8.super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->m_turn_history).subturns.
                super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)(this->m_turn_history).subturns.
                super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_b8.super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)(this->m_turn_history).subturns.
                super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_turn_history).subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__x->subturns).
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_turn_history).subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::~vector
            ((vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_> *)
             &local_b8);
  (this->m_turn_history).was_turn_cancelled = local_80._0_1_;
  std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::~vector
            (&local_98);
  do {
    next_subturn(this);
    SubturnHistory::gather_all_subturn_commands
              (&local_b8,
               (this->m_turn_history).subturns.
               super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    if (local_b8.super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_b8.super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>::~vector(&local_b8)
      ;
      break;
    }
    bVar4 = false;
    pCVar5 = local_b8.
             super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar1 = *(int *)&(((vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_> *)
                        &pCVar5->type)->
                       super__Vector_base<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>
                       )._M_impl.super__Vector_impl_data._M_start;
      if (iVar1 == 1) {
        bVar3 = true;
        bVar4 = false;
      }
      else if (iVar1 == 3) {
        bVar4 = (bool)(bVar3 ^ 1U | bVar4);
      }
      else if (iVar1 == 2) {
        (this->m_current_level).size.y = local_58.size.y;
        (this->m_current_level).level_idx = local_58.level_idx;
        (this->m_current_level).size.x = local_58.size.x;
        std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::operator=
                  (local_a0,&local_58.cells);
        std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::vector
                  (&local_98,&__x->subturns);
        local_80 = CONCAT71(local_80._1_7_,1);
        std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::operator=
                  (&__x->subturns,&local_78);
        (this->m_turn_history).was_turn_cancelled = local_60;
        std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::vector
                  ((vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_> *)
                   __return_storage_ptr__,&local_98);
        (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>).
        _M_payload.super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
        super__Optional_payload_base<PSEngine::TurnHistory>._M_payload._M_value.was_turn_cancelled =
             local_80._0_1_;
        (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>).
        _M_payload.super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
        super__Optional_payload_base<PSEngine::TurnHistory>._M_engaged = true;
        std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::~vector
                  (&local_98);
        std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>::~vector
                  (&local_b8);
        goto LAB_00110441;
      }
      pCVar5 = pCVar5 + 1;
    } while (pCVar5 != local_b8.
                       super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>::~vector(&local_b8);
  } while (bVar4);
  if ((this->m_turn_history).subturns.
      super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_turn_history).subturns.
      super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::vector<PSEngine::Level,_std::allocator<PSEngine::Level>_>::push_back
              (&this->m_level_state_stack,&local_58);
    print_subturns_history(this);
  }
  p_win_condition =
       (this->m_compiled_game).win_conditions.
       super__Vector_base<CompiledGame::WinCondition,_std::allocator<CompiledGame::WinCondition>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pWVar2 = (this->m_compiled_game).win_conditions.
           super__Vector_base<CompiledGame::WinCondition,_std::allocator<CompiledGame::WinCondition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (p_win_condition == pWVar2) {
LAB_001104ce:
      this->m_is_level_won = true;
LAB_001104d6:
      std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::vector
                ((vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_> *)
                 __return_storage_ptr__,&__x->subturns);
      (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>)._M_payload
      .super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
      super__Optional_payload_base<PSEngine::TurnHistory>._M_payload._M_value.was_turn_cancelled =
           (this->m_turn_history).was_turn_cancelled;
      (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>)._M_payload
      .super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
      super__Optional_payload_base<PSEngine::TurnHistory>._M_engaged = true;
LAB_00110441:
      std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::~vector
                (&local_78);
      std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector(&local_58.cells);
      return __return_storage_ptr__;
    }
    bVar4 = check_win_condition(this,p_win_condition);
    if (!bVar4) {
      if (!bVar3) goto LAB_001104d6;
      goto LAB_001104ce;
    }
    p_win_condition = p_win_condition + 1;
  } while( true );
}

Assistant:

optional<PSEngine::TurnHistory> PSEngine::next_turn()
{
    Level last_turn_save = m_current_level;
    TurnHistory last_turn_history_save = m_turn_history;

    m_turn_history = TurnHistory();

    bool win_requested_by_command = false;
    bool keep_computing_subturn = false;
    do
    {
        keep_computing_subturn = false;

        if(next_subturn())
        {
            vector<CompiledGame::Command> subturn_commands = m_turn_history.subturns.back().gather_all_subturn_commands();

            for(const auto& command : subturn_commands)
            {
                if(command.type == CompiledGame::CommandType::Win)
                {
                    win_requested_by_command = true;
                    keep_computing_subturn = false;
                }
                else if (command.type == CompiledGame::CommandType::Cancel)
                {
                    m_current_level = last_turn_save;
                    TurnHistory cancelled_turn_history = m_turn_history;
                    cancelled_turn_history.was_turn_cancelled = true;
                    m_turn_history = last_turn_history_save;
                    return optional<PSEngine::TurnHistory>(cancelled_turn_history);
                }
                else if (command.type == CompiledGame::CommandType::Again)
                {
                    if(!win_requested_by_command)
                    {
                        keep_computing_subturn = true;
                    }
                }

            }
        }

    } while (keep_computing_subturn); //todo add an infinite loop safety

    if( m_turn_history.subturns.size() > 0)
    {
        m_level_state_stack.push_back(last_turn_save);
        print_subturns_history();
    }
    //else it means nothing happened

    if(check_win_conditions() || win_requested_by_command)
    {
        m_is_level_won = true;
    }

    return optional<PSEngine::TurnHistory>(m_turn_history);
}